

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SizeT PPC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  byte bVar1;
  SizeT in_RAX;
  ulong uVar2;
  int iVar3;
  
  if (3 < size) {
    in_RAX = 0;
    uVar2 = 0;
    do {
      if ((data[uVar2] & 0xfc) == 0x48) {
        bVar1 = data[uVar2 + 3];
        if ((bVar1 & 3) == 1) {
          iVar3 = (bVar1 & 0xfffffffc |
                  (uint)data[uVar2 + 2] << 8 |
                  (uint)data[uVar2 + 1] << 0x10 | (data[uVar2] & 3) << 0x18) + (int)in_RAX;
          data[uVar2] = (byte)((uint)iVar3 >> 0x18) & 3 | 0x48;
          data[uVar2 + 1] = (Byte)((uint)iVar3 >> 0x10);
          data[uVar2 + 2] = (Byte)((uint)iVar3 >> 8);
          data[uVar2 + 3] = bVar1 + (char)in_RAX;
        }
      }
      uVar2 = uVar2 + 4;
      in_RAX = (SizeT)((int)in_RAX - 4);
    } while (uVar2 <= size - 4);
  }
  return in_RAX;
}

Assistant:

static SizeT PPC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] >> 2) == 0x12 && (data[i + 3] & 3) == 1)
    {
      UInt32 src = ((UInt32)(data[i + 0] & 3) << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3] & (~3));
      
      UInt32 dest;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      data[i + 0] = (Byte)(0x48 | ((dest >> 24) &  0x3));
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] &= 0x3;
      data[i + 3] |= dest;
    }
  }
  return i;
}